

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O2

void __thiscall
kj::_::
SplitBranch<kj::_::Tuple<kj::Promise<kj::HttpClient::ConnectRequest::Status>,_kj::Promise<kj::Maybe<kj::(anonymous_namespace)::HttpInputStreamImpl::ReleasedBuffer>_>_>,_0UL>
::get(SplitBranch<kj::_::Tuple<kj::Promise<kj::HttpClient::ConnectRequest::Status>,_kj::Promise<kj::Maybe<kj::(anonymous_namespace)::HttpInputStreamImpl::ReleasedBuffer>_>_>,_0UL>
      *this,ExceptionOrValue *output)

{
  NullableValue<kj::Exception> *other;
  
  other = (NullableValue<kj::Exception> *)((this->super_ForkBranchBase).hub.ptr)->resultRef;
  if (other[1].isSet == true) {
    NullableValue<kj::Promise<kj::HttpClient::ConnectRequest::Status>>::
    emplace<kj::Promise<kj::HttpClient::ConnectRequest::Status>>
              ((NullableValue<kj::Promise<kj::HttpClient::ConnectRequest::Status>> *)(output + 1),
               (Promise<kj::HttpClient::ConnectRequest::Status> *)&other[1].field_1.value);
  }
  else {
    Maybe<kj::Promise<kj::HttpClient::ConnectRequest::Status>_>::operator=
              ((Maybe<kj::Promise<kj::HttpClient::ConnectRequest::Status>_> *)(output + 1));
  }
  NullableValue<kj::Exception>::operator=((NullableValue<kj::Exception> *)output,other);
  ForkBranchBase::releaseHub(&this->super_ForkBranchBase,output);
  return;
}

Assistant:

void get(ExceptionOrValue& output) noexcept override {
    ExceptionOr<T>& hubResult = getHubResultRef().template as<T>();
    KJ_IF_SOME(value, hubResult.value) {
      output.as<Element>().value = kj::mv(kj::get<index>(value));
    } else {
      output.as<Element>().value = kj::none;
    }